

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

bool cmHasSuffix(string_view str,cmValue suffix)

{
  ulong __n1;
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_str = str._M_str;
  local_10._M_len = str._M_len;
  if (suffix.Value != (string *)0x0) {
    __n1 = (suffix.Value)->_M_string_length;
    if (__n1 <= local_10._M_len) {
      __str._M_str = ((suffix.Value)->_M_dataplus)._M_p;
      __str._M_len = __n1;
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_10,local_10._M_len - __n1,__n1,__str);
      return iVar1 == 0;
    }
  }
  return false;
}

Assistant:

inline bool cmHasSuffix(cm::string_view str, cmValue suffix)
{
  if (!suffix) {
    return false;
  }

  return str.size() >= suffix->size() &&
    str.compare(str.size() - suffix->size(), suffix->size(), *suffix) == 0;
}